

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  int iVar1;
  double __x;
  int client;
  ThreadPool<int,_8UL> threadPool;
  ServerSocket server;
  int *in_stack_fffffffffffffe78;
  ThreadPool<int,_8UL> *in_stack_fffffffffffffe80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffea0;
  int in_stack_fffffffffffffeac;
  ServerSocket *in_stack_fffffffffffffeb0;
  _func_void_int_ServerSocket_ptr *in_stack_fffffffffffffeb8;
  ThreadPool<int,_8UL> *in_stack_fffffffffffffec0;
  int in_stack_fffffffffffffefc;
  ServerSocket *in_stack_ffffffffffffff00;
  string local_a0 [55];
  allocator<char> local_69;
  string local_68 [32];
  string local_48 [32];
  ServerSocket local_28;
  undefined4 local_4;
  
  local_4 = 0;
  ServerSocket::ServerSocket(in_stack_ffffffffffffff00,in_stack_fffffffffffffefc);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffea0,(char *)in_stack_fffffffffffffe98,
             (allocator<char> *)in_stack_fffffffffffffe90);
  std::__cxx11::to_string(in_stack_fffffffffffffeac);
  std::operator+(in_stack_fffffffffffffe98,in_stack_fffffffffffffe90);
  ServerSocket::log(&local_28,__x);
  std::__cxx11::string::~string(local_48);
  std::__cxx11::string::~string(local_a0);
  std::__cxx11::string::~string(local_68);
  std::allocator<char>::~allocator(&local_69);
  ThreadPool<int,8ul>::ThreadPool<void(int,ServerSocket&)>
            (in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb0);
  do {
    do {
      iVar1 = ServerSocket::acceptConnection((ServerSocket *)0x104c4a);
    } while (iVar1 < 0);
    ThreadPool<int,_8UL>::addTask(in_stack_fffffffffffffe80,in_stack_fffffffffffffe78);
  } while( true );
}

Assistant:

int main(int argc, char const *argv[])
{
	ServerSocket server(PORT);
    server.log(string("Listening on port: ") + to_string(PORT));

    ThreadPool<int, THREADPOOL_SIZE> threadPool(handleConnection, server);

    while (true)
    {
		int client = server.acceptConnection();
        if (client < 0) continue;

        threadPool.addTask(client);
    }
    
    return 0;
}